

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_saver_exit_example.cpp
# Opt level: O1

void foo4(int *a)

{
  long *plVar1;
  
  *a = 4;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"foo4 a = ",9);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,*a);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"foo4 state_saver::dismiss",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  return;
}

Assistant:

void foo4(int& a) {
  MAKE_SAVER_EXIT(state_saver, a); // Custom state saver on exit.

  a = 4;
  std::cout << "foo4 a = " << a << std::endl;

  state_saver.dismiss(); // Dismiss, state will not automatically restored.
  std::cout << "foo4 state_saver::dismiss" << std::endl;
  // Original state will not automatically restored, on scope leave.
}